

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic-main.t.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  tests *specification;
  char **argv_local;
  int argc_local;
  
  specification = ::specification();
  iVar1 = lest::run(specification,argc,argv,(ostream *)&std::cout);
  return iVar1;
}

Assistant:

int main( int argc, char * argv[] )
{
    return lest::run( specification(), argc, argv );
}